

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DoubletonEquationPS::DoubletonEquationPS
          (DoubletonEquationPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int _j,int _k,int _i,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *oldLo,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *oldUp,shared_ptr<soplex::Tolerances> *tols)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Item *pIVar5;
  Real a;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int32_t iVar9;
  bool bVar10;
  int iVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_f8 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f0._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
    }
  }
  iVar11 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  iVar2 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006a2340;
  (this->super_PostStep).m_name = "DoubletonEquation";
  (this->super_PostStep).nCols = iVar2;
  (this->super_PostStep).nRows = iVar11;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_f8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_f0);
  if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DoubletonEquationPS_006a2a58;
  this->m_j = _j;
  this->m_k = _k;
  this->m_i = _i;
  this->m_maxSense = lp->thesense == MAXIMIZE;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[_j].m_backend.data + 0x20)
  ;
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[_j].m_backend.data;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[_j].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[_j].m_backend.data + 0x10);
  local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_a8.m_backend.exp = pnVar3[_j].m_backend.exp;
  local_a8.m_backend.neg = pnVar3[_j].m_backend.neg;
  local_a8.m_backend.fpclass = pnVar3[_j].m_backend.fpclass;
  local_a8.m_backend.prec_elem = pnVar3[_j].m_backend.prec_elem;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[_j].m_backend.data + 0x20)
  ;
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[_j].m_backend.data;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[_j].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[_j].m_backend.data + 0x10);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_e8.m_backend.exp = pnVar3[_j].m_backend.exp;
  local_e8.m_backend.neg = pnVar3[_j].m_backend.neg;
  local_e8.m_backend.fpclass = pnVar3[_j].m_backend.fpclass;
  local_e8.m_backend.prec_elem = pnVar3[_j].m_backend.prec_elem;
  a = Tolerances::epsilon((this->super_PostStep)._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  local_68.m_backend.fpclass = cpp_dec_float_finite;
  local_68.m_backend.prec_elem = 10;
  local_68.m_backend.data._M_elems[0] = 0;
  local_68.m_backend.data._M_elems[1] = 0;
  local_68.m_backend.data._M_elems[2] = 0;
  local_68.m_backend.data._M_elems[3] = 0;
  local_68.m_backend.data._M_elems[4] = 0;
  local_68.m_backend.data._M_elems[5] = 0;
  local_68.m_backend.data._M_elems._24_5_ = 0;
  local_68.m_backend.data._M_elems[7]._1_3_ = 0;
  local_68.m_backend.data._M_elems._32_5_ = 0;
  local_68.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,a);
  bVar10 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_a8,&local_e8,&local_68);
  this->m_jFixed = bVar10;
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&this->m_jObj,lp,_j);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&local_130,lp,_j);
    *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 8) =
         local_130.m_backend.data._M_elems._32_8_;
    *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 4) =
         local_130.m_backend.data._M_elems._16_8_;
    *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 6) =
         local_130.m_backend.data._M_elems._24_8_;
    *(undefined8 *)(this->m_jObj).m_backend.data._M_elems = local_130.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 2) =
         local_130.m_backend.data._M_elems._8_8_;
    (this->m_jObj).m_backend.exp = local_130.m_backend.exp;
    (this->m_jObj).m_backend.neg = local_130.m_backend.neg;
    (this->m_jObj).m_backend.fpclass = local_130.m_backend.fpclass;
    (this->m_jObj).m_backend.prec_elem = local_130.m_backend.prec_elem;
    if (local_130.m_backend.fpclass != cpp_dec_float_finite ||
        (this->m_jObj).m_backend.data._M_elems[0] != 0) {
      (this->m_jObj).m_backend.neg = (bool)(local_130.m_backend.neg ^ 1);
    }
  }
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&this->m_kObj,lp,_k);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&local_130,lp,_k);
    *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 8) =
         local_130.m_backend.data._M_elems._32_8_;
    *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 4) =
         local_130.m_backend.data._M_elems._16_8_;
    *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 6) =
         local_130.m_backend.data._M_elems._24_8_;
    *(undefined8 *)(this->m_kObj).m_backend.data._M_elems = local_130.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 2) =
         local_130.m_backend.data._M_elems._8_8_;
    (this->m_kObj).m_backend.exp = local_130.m_backend.exp;
    (this->m_kObj).m_backend.neg = local_130.m_backend.neg;
    (this->m_kObj).m_backend.fpclass = local_130.m_backend.fpclass;
    (this->m_kObj).m_backend.prec_elem = local_130.m_backend.prec_elem;
    if (local_130.m_backend.fpclass != cpp_dec_float_finite ||
        (this->m_kObj).m_backend.data._M_elems[0] != 0) {
      (this->m_kObj).m_backend.neg = (bool)(local_130.m_backend.neg ^ 1);
    }
  }
  pNVar4 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem
           [(lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[_j].idx].data.
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  *(undefined8 *)((this->m_aij).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&(pNVar4->val).m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&(pNVar4->val).m_backend.data;
  uVar7 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + 8);
  uVar8 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + 0x18);
  *(undefined8 *)((this->m_aij).m_backend.data._M_elems + 4) =
       *(undefined8 *)((long)&(pNVar4->val).m_backend.data + 0x10);
  *(undefined8 *)((this->m_aij).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_aij).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_aij).m_backend.data._M_elems + 2) = uVar7;
  (this->m_aij).m_backend.exp = (pNVar4->val).m_backend.exp;
  (this->m_aij).m_backend.neg = (pNVar4->val).m_backend.neg;
  iVar9 = (pNVar4->val).m_backend.prec_elem;
  (this->m_aij).m_backend.fpclass = (pNVar4->val).m_backend.fpclass;
  (this->m_aij).m_backend.prec_elem = iVar9;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar10 = false;
  if ((pnVar3[_k].m_backend.fpclass != cpp_dec_float_NaN) &&
     (bVar10 = false, (oldLo->m_backend).fpclass != cpp_dec_float_NaN)) {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&pnVar3[_k].m_backend,&oldLo->m_backend);
    bVar10 = 0 < iVar11;
  }
  this->m_strictLo = bVar10;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar10 = false;
  if ((pnVar3[_k].m_backend.fpclass != cpp_dec_float_NaN) &&
     (bVar10 = false, (oldUp->m_backend).fpclass != cpp_dec_float_NaN)) {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&pnVar3[_k].m_backend,&oldUp->m_backend);
    bVar10 = SUB41((uint)iVar11 >> 0x1f,0);
  }
  this->m_strictUp = bVar10;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar3[_k].m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&pnVar3[_k].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar3[_k].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[_k].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_newLo).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 2) = uVar7;
  (this->m_newLo).m_backend.exp = pnVar3[_k].m_backend.exp;
  (this->m_newLo).m_backend.neg = pnVar3[_k].m_backend.neg;
  iVar9 = pnVar3[_k].m_backend.prec_elem;
  (this->m_newLo).m_backend.fpclass = pnVar3[_k].m_backend.fpclass;
  (this->m_newLo).m_backend.prec_elem = iVar9;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar3[_k].m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&pnVar3[_k].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar3[_k].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[_k].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_newUp).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 2) = uVar7;
  (this->m_newUp).m_backend.exp = pnVar3[_k].m_backend.exp;
  (this->m_newUp).m_backend.neg = pnVar3[_k].m_backend.neg;
  iVar9 = pnVar3[_k].m_backend.prec_elem;
  (this->m_newUp).m_backend.fpclass = pnVar3[_k].m_backend.fpclass;
  (this->m_newUp).m_backend.prec_elem = iVar9;
  uVar6 = *(undefined8 *)((oldLo->m_backend).data._M_elems + 2);
  uVar7 = *(undefined8 *)((oldLo->m_backend).data._M_elems + 4);
  uVar8 = *(undefined8 *)((oldLo->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_oldLo).m_backend.data._M_elems =
       *(undefined8 *)(oldLo->m_backend).data._M_elems;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 2) = uVar6;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 4) = uVar7;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 8) =
       *(undefined8 *)((oldLo->m_backend).data._M_elems + 8);
  (this->m_oldLo).m_backend.exp = (oldLo->m_backend).exp;
  (this->m_oldLo).m_backend.neg = (oldLo->m_backend).neg;
  iVar9 = (oldLo->m_backend).prec_elem;
  (this->m_oldLo).m_backend.fpclass = (oldLo->m_backend).fpclass;
  (this->m_oldLo).m_backend.prec_elem = iVar9;
  uVar6 = *(undefined8 *)((oldUp->m_backend).data._M_elems + 2);
  uVar7 = *(undefined8 *)((oldUp->m_backend).data._M_elems + 4);
  uVar8 = *(undefined8 *)((oldUp->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_oldUp).m_backend.data._M_elems =
       *(undefined8 *)(oldUp->m_backend).data._M_elems;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 2) = uVar6;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 4) = uVar7;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8) =
       *(undefined8 *)((oldUp->m_backend).data._M_elems + 8);
  (this->m_oldUp).m_backend.exp = (oldUp->m_backend).exp;
  (this->m_oldUp).m_backend.neg = (oldUp->m_backend).neg;
  iVar9 = (oldUp->m_backend).prec_elem;
  (this->m_oldUp).m_backend.fpclass = (oldUp->m_backend).fpclass;
  (this->m_oldUp).m_backend.prec_elem = iVar9;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar3[_j].m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&pnVar3[_j].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar3[_j].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[_j].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_Lo_j).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 2) = uVar7;
  (this->m_Lo_j).m_backend.exp = pnVar3[_j].m_backend.exp;
  (this->m_Lo_j).m_backend.neg = pnVar3[_j].m_backend.neg;
  iVar9 = pnVar3[_j].m_backend.prec_elem;
  (this->m_Lo_j).m_backend.fpclass = pnVar3[_j].m_backend.fpclass;
  (this->m_Lo_j).m_backend.prec_elem = iVar9;
  pnVar3 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_Up_j).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar3[_j].m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&pnVar3[_j].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar3[_j].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[_j].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_Up_j).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_Up_j).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_Up_j).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_Up_j).m_backend.data._M_elems + 2) = uVar7;
  (this->m_Up_j).m_backend.exp = pnVar3[_j].m_backend.exp;
  (this->m_Up_j).m_backend.neg = pnVar3[_j].m_backend.neg;
  iVar9 = pnVar3[_j].m_backend.prec_elem;
  (this->m_Up_j).m_backend.fpclass = pnVar3[_j].m_backend.fpclass;
  (this->m_Up_j).m_backend.prec_elem = iVar9;
  pnVar3 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar3[_i].m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&pnVar3[_i].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar3[_i].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[_i].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_lhs).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 2) = uVar7;
  (this->m_lhs).m_backend.exp = pnVar3[_i].m_backend.exp;
  (this->m_lhs).m_backend.neg = pnVar3[_i].m_backend.neg;
  iVar9 = pnVar3[_i].m_backend.prec_elem;
  (this->m_lhs).m_backend.fpclass = pnVar3[_i].m_backend.fpclass;
  (this->m_lhs).m_backend.prec_elem = iVar9;
  pnVar3 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar3[_i].m_backend.data + 0x20);
  uVar6 = *(undefined8 *)&pnVar3[_i].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar3[_i].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[_i].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 6) = uVar8;
  *(undefined8 *)(this->m_rhs).m_backend.data._M_elems = uVar6;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 2) = uVar7;
  (this->m_rhs).m_backend.exp = pnVar3[_i].m_backend.exp;
  (this->m_rhs).m_backend.neg = pnVar3[_i].m_backend.neg;
  iVar9 = pnVar3[_i].m_backend.prec_elem;
  (this->m_rhs).m_backend.fpclass = pnVar3[_i].m_backend.fpclass;
  (this->m_rhs).m_backend.prec_elem = iVar9;
  pIVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar11 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thekey[_k].idx;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a0f40;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             pIVar5[iVar11].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(pIVar5 + iVar11));
  return;
}

Assistant:

DoubletonEquationPS(const SPxLPBase<R>& lp, int _j, int _k, int _i, R oldLo, R oldUp,
                          std::shared_ptr<Tolerances> tols)
         : PostStep("DoubletonEquation", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_k(_k)
         , m_i(_i)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_jFixed(EQ(lp.lower(_j), lp.upper(_j), this->epsilon()))
         , m_jObj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_kObj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_k) : -lp.obj(_k))
         , m_aij(lp.colVector(_j).value(0))
         , m_strictLo(lp.lower(_k) > oldLo)
         , m_strictUp(lp.upper(_k) < oldUp)
         , m_newLo(lp.lower(_k))
         , m_newUp(lp.upper(_k))
         , m_oldLo(oldLo)
         , m_oldUp(oldUp)
         , m_Lo_j(lp.lower(_j))
         , m_Up_j(lp.upper(_j))
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_col(lp.colVector(_k))
      {}